

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_class.c
# Opt level: O2

void oonf_class_add(oonf_class *ci)

{
  ci->total_size = ci->size + 0xf & 0xfffffffffffffff0;
  (ci->_node).key = ci->name;
  avl_insert(&_classes_tree,&ci->_node);
  if (ci->to_keystring == (_func_char_ptr_oonf_objectkey_str_ptr_oonf_class_ptr_void_ptr *)0x0) {
    ci->to_keystring = _cb_to_keystring;
  }
  (ci->_free_list).prev = &ci->_free_list;
  (ci->_free_list).next = &ci->_free_list;
  (ci->_extensions).prev = &ci->_extensions;
  (ci->_extensions).next = &ci->_extensions;
  if (((&log_global_mask)[_oonf_class_subsystem.logging] & 1) != 0) {
    oonf_log(1,(ulong)_oonf_class_subsystem.logging,"src/base/oonf_class.c",0x83,0,0,
             "Class %s added: %zu bytes\n",ci->name,ci->total_size);
  }
  return;
}

Assistant:

void
oonf_class_add(struct oonf_class *ci) {
  /* round up size to make block extendable */
  ci->total_size = _roundup(ci->size);

  /* hook into tree */
  ci->_node.key = ci->name;
  avl_insert(&_classes_tree, &ci->_node);

  /* add standard key generator if necessary */
  if (ci->to_keystring == NULL) {
    ci->to_keystring = _cb_to_keystring;
  }

  /* Init list heads */
  list_init_head(&ci->_free_list);
  list_init_head(&ci->_extensions);

  OONF_DEBUG(LOG_CLASS, "Class %s added: %" PRINTF_SIZE_T_SPECIFIER " bytes\n", ci->name, ci->total_size);
}